

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__create_3d__size
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  xmlChar **ppxVar1;
  ParserChar *buffer;
  bool bVar2;
  uint32 uVar3;
  uint uVar4;
  undefined8 in_RAX;
  uint *puVar5;
  undefined *puVar6;
  xmlChar *text;
  bool failed_2;
  bool failed_1;
  bool failed;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  puVar5 = (uint *)GeneratedSaxParser::StackMemoryManager::newObject
                             (&(this->
                               super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                               ).super_ParserTemplateBase.mStackMemoryManager,0x10);
  puVar5[0] = 0;
  puVar5[1] = 0;
  puVar5[2] = 0;
  puVar5[3] = 0;
  *attributeDataPtr = puVar5;
  ppxVar1 = attributes->attributes;
  if ((ppxVar1 != (xmlChar **)0x0) && (text = *ppxVar1, text != (xmlChar *)0x0)) {
    do {
      puVar6 = (undefined *)GeneratedSaxParser::Utils::calculateStringHash(text);
      buffer = ppxVar1[1];
      if (puVar6 == (undefined *)0x6ac7a8) {
        uVar3 = GeneratedSaxParser::Utils::toUint32(buffer,(bool *)((long)&uStack_38 + 5));
        puVar5[3] = uVar3;
        if (uStack_38._5_1_ == 1) {
          bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0x7a105,0x6ac7a8,buffer);
          if (bVar2) {
            return false;
          }
        }
        if ((uStack_38._5_1_ & 1) == 0) {
          *(byte *)puVar5 = (byte)*puVar5 | 4;
        }
      }
      else if (puVar6 == (undefined *)0x6ebfdf4) {
        uVar3 = GeneratedSaxParser::Utils::toUint32(buffer,(bool *)((long)&uStack_38 + 6));
        puVar5[2] = uVar3;
        if (uStack_38._6_1_ == 1) {
          bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0x7a105,0x6ebfdf4,buffer);
          if (bVar2) {
            return false;
          }
        }
        if ((uStack_38._6_1_ & 1) == 0) {
          *(byte *)puVar5 = (byte)*puVar5 | 2;
        }
      }
      else if (puVar6 == &DAT_007dfba8) {
        uVar3 = GeneratedSaxParser::Utils::toUint32(buffer,(bool *)((long)&uStack_38 + 7));
        puVar5[1] = uVar3;
        if (uStack_38._7_1_ == 1) {
          bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0x7a105,0x7dfba8,buffer);
          if (bVar2) {
            return false;
          }
        }
        if ((uStack_38._7_1_ & 1) == 0) {
          *(byte *)puVar5 = (byte)*puVar5 | 1;
        }
      }
      else {
        bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                          ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                           ERROR_UNKNOWN_ATTRIBUTE,0x7a105,text,buffer);
        if (bVar2) {
          return false;
        }
      }
      text = ppxVar1[2];
      ppxVar1 = ppxVar1 + 2;
    } while (text != (xmlChar *)0x0);
    uVar4 = *puVar5;
    if ((uVar4 & 1) != 0) goto LAB_00727731;
  }
  bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                    ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                     ERROR_REQUIRED_ATTRIBUTE_MISSING,0x7a105,0x7dfba8,(ParserChar *)0x0);
  if (bVar2) {
    return false;
  }
  uVar4 = *puVar5;
LAB_00727731:
  if ((uVar4 & 2) == 0) {
    bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                      ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                       ERROR_REQUIRED_ATTRIBUTE_MISSING,0x7a105,0x6ebfdf4,(ParserChar *)0x0);
    if (bVar2) {
      return false;
    }
    uVar4 = *puVar5;
  }
  if (((uVar4 & 4) == 0) &&
     (bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                        ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                         ERROR_REQUIRED_ATTRIBUTE_MISSING,0x7a105,0x6ac7a8,(ParserChar *)0x0), bVar2
     )) {
    return false;
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__create_3d__size( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__create_3d__size( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

create_3d__size__AttributeData* attributeData = newData<create_3d__size__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_WIDTH:
    {
bool failed;
attributeData->width = GeneratedSaxParser::Utils::toUint32(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_SIZE,
        HASH_ATTRIBUTE_WIDTH,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= create_3d__size__AttributeData::ATTRIBUTE_WIDTH_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_HEIGHT:
    {
bool failed;
attributeData->height = GeneratedSaxParser::Utils::toUint32(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_SIZE,
        HASH_ATTRIBUTE_HEIGHT,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= create_3d__size__AttributeData::ATTRIBUTE_HEIGHT_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_DEPTH:
    {
bool failed;
attributeData->depth = GeneratedSaxParser::Utils::toUint32(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_SIZE,
        HASH_ATTRIBUTE_DEPTH,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= create_3d__size__AttributeData::ATTRIBUTE_DEPTH_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_SIZE, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ( (attributeData->present_attributes & create_3d__size__AttributeData::ATTRIBUTE_WIDTH_PRESENT) == 0 )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_SIZE, HASH_ATTRIBUTE_WIDTH, 0 ) )
        return false;
}
if ( (attributeData->present_attributes & create_3d__size__AttributeData::ATTRIBUTE_HEIGHT_PRESENT) == 0 )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_SIZE, HASH_ATTRIBUTE_HEIGHT, 0 ) )
        return false;
}
if ( (attributeData->present_attributes & create_3d__size__AttributeData::ATTRIBUTE_DEPTH_PRESENT) == 0 )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_SIZE, HASH_ATTRIBUTE_DEPTH, 0 ) )
        return false;
}


    return true;
}